

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitRandomTest_x_iutest_x_Size64_Test::Body(iu_UnitRandomTest_x_iutest_x_Size64_Test *this)

{
  bool bVar1;
  UInt64 UVar2;
  char *message;
  unsigned_long (*in_R9) [10];
  AssertionHelper local_2d0;
  Fixed local_2a0;
  undefined1 local_108 [8];
  AssertionResult iutest_ar;
  int i_1;
  UInt64 y [10];
  int local_7c;
  int i;
  UInt64 x [10];
  undefined1 local_20 [8];
  iuRandom r;
  iu_UnitRandomTest_x_iutest_x_Size64_Test *this_local;
  
  r.m_engine._8_8_ = this;
  iutest::detail::iuRandom::iuRandom((iuRandom *)local_20);
  for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    UVar2 = iutest::detail::iuRandom::genrand<unsigned_long>((iuRandom *)local_20);
    *(UInt64 *)(&stack0xffffffffffffff88 + (long)local_7c * 8) = UVar2 >> 0x20;
  }
  for (iutest_ar._36_4_ = 0; (int)iutest_ar._36_4_ < 10; iutest_ar._36_4_ = iutest_ar._36_4_ + 1) {
    UVar2 = iutest::detail::iuRandom::genrand<unsigned_long>((iuRandom *)local_20);
    *(UInt64 *)(&stack0xffffffffffffff28 + (long)(int)iutest_ar._36_4_ * 8) = UVar2 >> 0x20;
  }
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperNeRange<unsigned_long[10],unsigned_long[10]>
            ((AssertionResult *)local_108,(iuutil *)0x1c9ec9,"y",&stack0xffffffffffffff88,
             (unsigned_long (*) [10])&stack0xffffffffffffff28,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    memset(&local_2a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2a0);
    message = iutest::AssertionResult::message((AssertionResult *)local_108);
    iutest::AssertionHelper::AssertionHelper
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x44,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_2d0,&local_2a0);
    iutest::AssertionHelper::~AssertionHelper(&local_2d0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2a0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

IUTEST(UnitRandomTest, Size64)
{
    ::iutest::detail::iuRandom r;
    iutest::UInt64 x[10];
    for( int i=0; i < 10; ++i)
    {
        x[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    iutest::UInt64 y[10];
    for( int i=0; i < 10; ++i)
    {
        y[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    IUTEST_EXPECT_NE_RANGE(x, y);
}